

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O2

TValue * cpparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  int *piVar1;
  ushort *puVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  char cVar6;
  lua_State *plVar7;
  byte bVar8;
  MSize i;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  void *pvVar19;
  char *pcVar20;
  size_t sVar21;
  GCproto *pt;
  void *pvVar22;
  GCtab *t;
  TValue *pTVar23;
  GCfunc *pGVar24;
  GCstr *pGVar25;
  byte bVar26;
  ulong uVar27;
  long lVar28;
  uint32_t hbits;
  MSize size;
  undefined4 *puVar29;
  double *pdVar30;
  void *__dest;
  short sVar31;
  uint uVar32;
  ErrMsg em;
  lua_State *plVar33;
  byte *pbVar34;
  byte *pbVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  bool bVar39;
  uint32_t local_374;
  FuncScope local_320;
  TValue local_310;
  long local_308;
  FuncScope *local_2f8;
  uint8_t local_2d8;
  undefined8 local_2cc;
  undefined8 uStack_2c4;
  byte local_2b8;
  undefined1 local_2b7;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  *(lua_State **)((long)ud + 8) = L;
  *(undefined8 *)ud = 0;
  *(undefined4 *)((long)ud + 0x2c) = 0;
  *(undefined8 *)((long)ud + 0x30) = 0;
  *(undefined8 *)((long)ud + 0x24) = 0x12100000000;
  *(undefined8 *)((long)ud + 0x78) = 0;
  *(undefined8 *)((long)ud + 0x80) = 0;
  *(undefined8 *)((long)ud + 0x84) = 0;
  *(undefined8 *)((long)ud + 0x8c) = 0;
  *(undefined8 *)((long)ud + 0x58) = 0x100000001;
  pvVar19 = lj_mem_realloc(L,*(void **)((long)ud + 0x38),*(MSize *)((long)ud + 0x44),0x20);
  *(void **)((long)ud + 0x38) = pvVar19;
  *(undefined4 *)((long)ud + 0x44) = 0x20;
  piVar1 = (int *)((long)ud + 0x2c);
  iVar3 = *piVar1;
  *piVar1 = *piVar1 + -1;
  if (iVar3 == 0) {
    uVar9 = fillbuf((LexState *)ud);
  }
  else {
    pbVar34 = *(byte **)((long)ud + 0x30);
    *(byte **)((long)ud + 0x30) = pbVar34 + 1;
    uVar9 = (uint)*pbVar34;
  }
  *(uint *)((long)ud + 0x20) = uVar9;
  uVar32 = uVar9;
  if (uVar9 == 0xef) {
    uVar32 = *(uint *)((long)ud + 0x2c);
    bVar39 = true;
    if (((1 < uVar32) && (pcVar20 = *(char **)((long)ud + 0x30), *pcVar20 == -0x45)) &&
       (pcVar20[1] == -0x41)) {
      *(char **)((long)ud + 0x30) = pcVar20 + 2;
      *(uint *)((long)ud + 0x2c) = uVar32 - 3;
      if (uVar32 == 2) {
        uVar32 = fillbuf((LexState *)ud);
      }
      else {
        *(char **)((long)ud + 0x30) = pcVar20 + 3;
        uVar32 = (uint)(byte)pcVar20[2];
      }
      *(uint *)((long)ud + 0x20) = uVar32;
      goto LAB_0010fcf9;
    }
  }
  else {
LAB_0010fcf9:
    if (uVar32 == 0x23) {
      do {
        piVar1 = (int *)((long)ud + 0x2c);
        iVar3 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar3 == 0) {
          uVar9 = fillbuf((LexState *)ud);
        }
        else {
          pbVar34 = *(byte **)((long)ud + 0x30);
          *(byte **)((long)ud + 0x30) = pbVar34 + 1;
          uVar9 = (uint)*pbVar34;
        }
        *(uint *)((long)ud + 0x20) = uVar9;
        if (uVar9 == 0xffffffff) {
          bVar39 = true;
          goto LAB_0010fdc2;
        }
      } while ((uVar9 != 10) && (uVar9 != 0xd));
      inclinenumber((LexState *)ud);
      bVar39 = true;
      uVar32 = *(uint *)((long)ud + 0x20);
    }
    else {
      bVar39 = uVar32 != 0x1b;
      if (uVar9 != 0xef) goto LAB_0010fdc2;
    }
    if (uVar32 == 0x1b) {
      pTVar23 = L->top;
      L->top = pTVar23 + 1;
      em = LJ_ERR_BCBAD;
      goto LAB_00110786;
    }
  }
LAB_0010fdc2:
  if (*(char **)((long)ud + 0x70) != (char *)0x0) {
    iVar3 = 0x62;
    if (bVar39) {
      iVar3 = 0x74;
    }
    pcVar20 = strchr(*(char **)((long)ud + 0x70),iVar3);
    if (pcVar20 == (char *)0x0) {
      pTVar23 = L->top;
      L->top = pTVar23 + 1;
      em = LJ_ERR_XMODE;
LAB_00110786:
      pGVar25 = lj_err_str(L,em);
      (pTVar23->u32).lo = (uint32_t)pGVar25;
      (pTVar23->field_2).it = 0xfffffffb;
      lj_err_throw(L,3);
    }
  }
  if (bVar39) {
    plVar7 = *(lua_State **)((long)ud + 8);
    pcVar20 = *(char **)((long)ud + 0x68);
    sVar21 = strlen(pcVar20);
    pGVar25 = lj_str_new(plVar7,pcVar20,sVar21);
    *(GCstr **)((long)ud + 0x60) = pGVar25;
    pTVar23 = plVar7->top;
    (pTVar23->u32).lo = (uint32_t)pGVar25;
    (pTVar23->field_2).it = 0xfffffffb;
    pTVar23 = plVar7->top;
    plVar7->top = pTVar23 + 1;
    if ((TValue *)(ulong)(plVar7->maxstack).ptr32 <= pTVar23 + 1) {
      lj_state_growstack1(plVar7);
    }
    *(undefined4 *)((long)ud + 0x94) = 0;
    fs_init((LexState *)ud,(FuncState *)&local_310.field_2);
    local_2b7 = 0;
    local_2cc = 0;
    uStack_2c4 = 0;
    local_2b8 = local_2b8 | 2;
    local_320.nactvar = local_2d8;
    local_320.flags = '\0';
    local_320.vstart = *(MSize *)(local_308 + 0x84);
    local_320.prev = local_2f8;
    local_2f8 = &local_320;
    bcemit_INS((FuncState *)&local_310.field_2,0x58);
    lj_lex_next((LexState *)ud);
    parse_chunk((LexState *)ud);
    if (*(int *)((long)ud + 0x24) != 0x121) {
      err_token((LexState *)ud,0x121);
    }
    pt = fs_finish((LexState *)ud,*(BCLine *)((long)ud + 0x58));
    plVar7->top = plVar7->top + -1;
LAB_00110682:
    pGVar24 = func_newL(L,pt,(GCtab *)(ulong)(L->env).gcptr32);
    bVar8 = pt->sizeuv;
    for (uVar38 = 0; bVar8 != uVar38; uVar38 = uVar38 + 1) {
      pvVar19 = lj_mem_newgco(L,0x18);
      *(undefined2 *)((long)pvVar19 + 5) = 0x105;
      *(undefined4 *)((long)pvVar19 + 0xc) = 0xffffffff;
      *(int *)((long)pvVar19 + 0x10) = (int)pvVar19 + 8;
      *(uint *)((long)pvVar19 + 0x14) =
           (uint)*(ushort *)((ulong)(pt->uv).ptr32 + uVar38 * 2) << 0x18 ^ (uint)pt;
      *(int *)((long)pGVar24 + uVar38 * 4 + 0x14) = (int)pvVar19;
    }
    (pGVar24->c).nupvalues = bVar8;
    pTVar23 = L->top;
    L->top = pTVar23 + 1;
    (pTVar23->u32).lo = (uint32_t)pGVar24;
    (pTVar23->field_2).it = 0xfffffff7;
    return (TValue *)0x0;
  }
  plVar7 = *(lua_State **)((long)ud + 8);
  *(uint32_t *)((long)ud + 0x5c) = *(int *)&plVar7->top - (plVar7->stack).ptr32;
  *(undefined4 *)((long)ud + 0x40) = 0;
  uVar9 = *(uint *)((long)ud + 0x2c);
  if (uVar9 < 0xd) {
    bcread_fill((LexState *)ud,0xd,0);
    uVar9 = *(uint *)((long)ud + 0x2c);
  }
  *(uint *)((long)ud + 0x2c) = uVar9 - 1;
  pcVar20 = *(char **)((long)ud + 0x30);
  *(char **)((long)ud + 0x30) = pcVar20 + 1;
  if (*pcVar20 == 'L') {
    *(uint *)((long)ud + 0x2c) = uVar9 - 2;
    *(char **)((long)ud + 0x30) = pcVar20 + 2;
    if (pcVar20[1] == 'J') {
      *(uint *)((long)ud + 0x2c) = uVar9 - 3;
      *(char **)((long)ud + 0x30) = pcVar20 + 3;
      if (pcVar20[2] == '\x01') {
        uVar10 = bcread_uleb128((LexState *)ud);
        *(uint32_t *)((long)ud + 0x94) = uVar10;
        if (uVar10 < 8) {
          if ((3 < uVar10) &&
             (plVar33 = *(lua_State **)((long)ud + 8),
             *(int *)((ulong)(plVar33->glref).ptr32 + 0xfc) == 0)) {
            pTVar23 = plVar33->top;
            uVar9 = (plVar33->stack).ptr32;
            luaopen_ffi(plVar33);
            plVar33->top = (TValue *)
                           ((long)pTVar23 + ((ulong)(plVar33->stack).ptr32 - (ulong)uVar9));
          }
          if ((uVar10 & 2) == 0) {
            uVar10 = bcread_uleb128((LexState *)ud);
            uVar9 = *(uint *)((long)ud + 0x2c);
            if (uVar9 < uVar10) {
              bcread_fill((LexState *)ud,uVar10,1);
              uVar9 = *(uint *)((long)ud + 0x2c);
            }
            plVar33 = *(lua_State **)((long)ud + 8);
            pcVar20 = *(char **)((long)ud + 0x30);
            *(uint *)((long)ud + 0x2c) = uVar9 - uVar10;
            sVar21 = (size_t)uVar10;
            *(char **)((long)ud + 0x30) = pcVar20 + sVar21;
          }
          else {
            plVar33 = *(lua_State **)((long)ud + 8);
            pcVar20 = *(char **)((long)ud + 0x68);
            sVar21 = strlen(pcVar20);
          }
          pGVar25 = lj_str_new(plVar33,pcVar20,sVar21);
          *(GCstr **)((long)ud + 0x60) = pGVar25;
          while (uVar9 = *(uint *)((long)ud + 0x2c), uVar9 == 0) {
LAB_00110006:
            bcread_fill((LexState *)ud,5,0);
LAB_00110013:
            uVar10 = bcread_uleb128((LexState *)ud);
            uVar9 = *(uint *)((long)ud + 0x2c);
            if (uVar10 == 0) goto LAB_00110657;
            if (uVar9 < uVar10) {
              bcread_fill((LexState *)ud,uVar10,1);
              uVar9 = *(uint *)((long)ud + 0x2c);
            }
            *(uint *)((long)ud + 0x2c) = uVar9 - 1;
            pbVar34 = *(byte **)((long)ud + 0x30);
            *(byte **)((long)ud + 0x30) = pbVar34 + 1;
            bVar8 = *pbVar34;
            *(uint *)((long)ud + 0x2c) = uVar9 - 2;
            *(byte **)((long)ud + 0x30) = pbVar34 + 2;
            bVar26 = pbVar34[1];
            *(uint *)((long)ud + 0x2c) = uVar9 - 3;
            *(byte **)((long)ud + 0x30) = pbVar34 + 3;
            bVar4 = pbVar34[2];
            *(uint *)((long)ud + 0x2c) = uVar9 - 4;
            *(byte **)((long)ud + 0x30) = pbVar34 + 4;
            bVar5 = pbVar34[3];
            uVar11 = bcread_uleb128((LexState *)ud);
            uVar12 = bcread_uleb128((LexState *)ud);
            uVar13 = bcread_uleb128((LexState *)ud);
            local_374 = 0;
            if ((*(byte *)((long)ud + 0x94) & 2) == 0) {
              uVar14 = bcread_uleb128((LexState *)ud);
              uVar15 = 0;
              sVar21 = 0;
              if (uVar14 != 0) {
                uVar15 = bcread_uleb128((LexState *)ud);
                local_374 = bcread_uleb128((LexState *)ud);
                sVar21 = (size_t)uVar14;
              }
            }
            else {
              uVar15 = 0;
              sVar21 = 0;
            }
            uVar37 = uVar13 + 1;
            uVar32 = (uVar11 + uVar37) * 4 + 0x47 & 0xfffffff8;
            iVar36 = uVar32 + uVar12 * 8;
            uVar16 = ((uint)bVar5 * 2 + 2 & 0xfffffffc) + iVar36;
            iVar3 = (int)sVar21;
            size = iVar3 + uVar16;
            pvVar22 = lj_mem_newgco(*(lua_State **)((long)ud + 8),size);
            *(undefined1 *)((long)pvVar22 + 5) = 7;
            *(byte *)((long)pvVar22 + 6) = bVar26;
            *(byte *)((long)pvVar22 + 7) = bVar4;
            *(uint *)((long)pvVar22 + 8) = uVar37;
            lVar28 = (long)pvVar22 + (ulong)uVar32;
            *(int *)((long)pvVar22 + 0x10) = (int)lVar28;
            *(uint32_t *)((long)pvVar22 + 0x14) = iVar36 + (uint32_t)pvVar22;
            *(undefined4 *)((long)pvVar22 + 0x18) = 0;
            *(uint32_t *)((long)pvVar22 + 0x1c) = uVar12;
            *(MSize *)((long)pvVar22 + 0x20) = size;
            *(byte *)((long)pvVar22 + 0x24) = bVar5;
            *(byte *)((long)pvVar22 + 0x25) = bVar8;
            *(undefined2 *)((long)pvVar22 + 0x26) = 0;
            *(undefined4 *)((long)pvVar22 + 0x28) = *(undefined4 *)((long)ud + 0x60);
            *(undefined4 *)(lVar28 + (ulong)(uVar11 + 1) * -4) = 0;
            bVar8 = (bVar8 & 2) >> 1;
            *(uint *)((long)pvVar22 + 0x40) =
                 (uint)bVar8 + (uint)bVar8 * 2 + (uint)bVar4 * 0x100 + 0x55;
            uVar32 = uVar37 * 4 - 4;
            pvVar19 = *(void **)((long)ud + 0x30);
            *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar32;
            *(ulong *)((long)ud + 0x30) = (long)pvVar19 + (ulong)uVar32;
            memcpy((void *)((long)pvVar22 + 0x44),pvVar19,(ulong)uVar32);
            if ((*(byte *)((long)ud + 0x94) & 1) != 0) {
              for (lVar28 = 0x11; lVar28 - 0x10U < (ulong)uVar37; lVar28 = lVar28 + 1) {
                uVar32 = *(uint *)((long)pvVar22 + lVar28 * 4);
                *(uint *)((long)pvVar22 + lVar28 * 4) =
                     uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                     uVar32 << 0x18;
              }
            }
            if (bVar5 != 0) {
              uVar37 = (uint)bVar5 + (uint)bVar5;
              uVar32 = *(uint *)((long)pvVar22 + 0x14);
              pvVar19 = *(void **)((long)ud + 0x30);
              *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar37;
              *(ulong *)((long)ud + 0x30) = (long)pvVar19 + (ulong)uVar37;
              memcpy((void *)(ulong)uVar32,pvVar19,(ulong)uVar37);
              if ((*(byte *)((long)ud + 0x94) & 1) != 0) {
                for (uVar38 = 0; bVar5 != uVar38; uVar38 = uVar38 + 1) {
                  puVar2 = (ushort *)((long)(ulong)uVar32 + uVar38 * 2);
                  *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
                }
              }
            }
            puVar29 = (undefined4 *)((ulong)*(uint *)((long)pvVar22 + 0x10) + (ulong)uVar11 * -4);
            for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
              uVar17 = bcread_uleb128((LexState *)ud);
              if (uVar17 < 5) {
                if (uVar17 == 0) {
                  lVar28 = *(long *)((long)ud + 8);
                  uVar38 = *(ulong *)(lVar28 + 0x18);
                  if (uVar38 <= (long)*(int *)((long)ud + 0x5c) + (ulong)*(uint *)(lVar28 + 0x24))
                  goto LAB_00110753;
                  *(ulong *)(lVar28 + 0x18) = uVar38 - 8;
                  *puVar29 = *(undefined4 *)(uVar38 - 8);
                }
                else if (uVar17 == 1) {
                  uVar17 = bcread_uleb128((LexState *)ud);
                  uVar18 = bcread_uleb128((LexState *)ud);
                  if (uVar18 == 0) {
                    hbits = 0;
                  }
                  else {
                    hbits = 1;
                    if (uVar18 != 1) {
                      uVar32 = 0x1f;
                      if (uVar18 - 1 != 0) {
                        for (; uVar18 - 1 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                        }
                      }
                      hbits = (uVar32 ^ 0xffffffe0) + 0x21;
                    }
                  }
                  t = lj_tab_new(*(lua_State **)((long)ud + 8),uVar17,hbits);
                  if (uVar17 != 0) {
                    pTVar23 = (TValue *)(ulong)(t->array).ptr32;
                    while (bVar39 = uVar17 != 0, uVar17 = uVar17 - 1, bVar39) {
                      bcread_ktabk((LexState *)ud,pTVar23);
                      pTVar23 = pTVar23 + 1;
                    }
                  }
                  if (uVar18 != 0) {
                    while (bVar39 = uVar18 != 0, uVar18 = uVar18 - 1, bVar39) {
                      bcread_ktabk((LexState *)ud,&local_310);
                      pTVar23 = lj_tab_set(*(lua_State **)((long)ud + 8),t,&local_310);
                      bcread_ktabk((LexState *)ud,pTVar23);
                    }
                  }
                  *puVar29 = (int)t;
                }
                else {
                  sVar31 = (uVar17 != 2) + 0xb;
                  if (uVar17 == 4) {
                    sVar31 = 0x10;
                  }
                  pvVar19 = lj_mem_newgco(*(lua_State **)((long)ud + 8),
                                          (uint)(uVar17 == 4) * 8 + 0x10);
                  *(undefined1 *)((long)pvVar19 + 5) = 10;
                  *(short *)((long)pvVar19 + 6) = sVar31;
                  *puVar29 = (int)pvVar19;
                  uVar18 = bcread_uleb128((LexState *)ud);
                  *(uint32_t *)((long)pvVar19 + 8) = uVar18;
                  uVar18 = bcread_uleb128((LexState *)ud);
                  *(uint32_t *)((long)pvVar19 + 0xc) = uVar18;
                  if (uVar17 == 4) {
                    uVar17 = bcread_uleb128((LexState *)ud);
                    *(uint32_t *)((long)pvVar19 + 0x10) = uVar17;
                    uVar17 = bcread_uleb128((LexState *)ud);
                    *(uint32_t *)((long)pvVar19 + 0x14) = uVar17;
                  }
                }
              }
              else {
                uVar32 = uVar17 - 5;
                pcVar20 = *(char **)((long)ud + 0x30);
                *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar32;
                *(char **)((long)ud + 0x30) = pcVar20 + uVar32;
                pGVar25 = lj_str_new(*(lua_State **)((long)ud + 8),pcVar20,(ulong)uVar32);
                *puVar29 = (int)pGVar25;
              }
              puVar29 = puVar29 + 1;
            }
            *(uint32_t *)((long)pvVar22 + 0x18) = uVar11;
            pdVar30 = (double *)(ulong)*(uint *)((long)pvVar22 + 0x10);
            for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
              bVar8 = **(byte **)((long)ud + 0x30);
              pbVar34 = *(byte **)((long)ud + 0x30) + 1;
              uVar32 = (uint)(bVar8 >> 1);
              if ((char)bVar8 < '\0') {
                uVar32 = uVar32 & 0x3f;
                iVar36 = *(int *)((long)ud + 0x2c);
                bVar26 = 6;
                pbVar35 = pbVar34;
                do {
                  uVar32 = uVar32 | (*pbVar35 & 0x7f) << (bVar26 & 0x1f);
                  iVar36 = iVar36 + -1;
                  *(int *)((long)ud + 0x2c) = iVar36;
                  pbVar34 = pbVar35 + 1;
                  bVar26 = bVar26 + 7;
                  bVar4 = *pbVar35;
                  pbVar35 = pbVar34;
                } while ((char)bVar4 < '\0');
              }
              else {
                iVar36 = *(int *)((long)ud + 0x2c);
              }
              *(int *)((long)ud + 0x2c) = iVar36 + -1;
              *(byte **)((long)ud + 0x30) = pbVar34;
              if ((bVar8 & 1) == 0) {
                *pdVar30 = (double)(int)uVar32;
              }
              else {
                *(uint *)pdVar30 = uVar32;
                uVar14 = bcread_uleb128((LexState *)ud);
                *(uint32_t *)((long)pdVar30 + 4) = uVar14;
              }
              pdVar30 = pdVar30 + 1;
            }
            *(uint32_t *)((long)pvVar22 + 0x2c) = uVar15;
            *(uint32_t *)((long)pvVar22 + 0x30) = local_374;
            if (iVar3 == 0) {
              *(undefined8 *)((long)pvVar22 + 0x34) = 0;
              uVar32 = 0;
            }
            else {
              bVar8 = 2 - ((int)local_374 < 0x10000);
              if ((int)local_374 < 0x100) {
                bVar8 = 0;
              }
              uVar38 = (long)pvVar22 + (ulong)uVar16;
              iVar36 = (int)uVar38;
              *(int *)((long)pvVar22 + 0x34) = iVar36;
              *(uint32_t *)((long)pvVar22 + 0x38) = (uVar13 << (bVar8 & 0x1f)) + iVar36;
              pvVar19 = *(void **)((long)ud + 0x30);
              *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - iVar3;
              __dest = (void *)(uVar38 & 0xffffffff);
              *(size_t *)((long)ud + 0x30) = (long)pvVar19 + sVar21;
              memcpy(__dest,pvVar19,sVar21);
              if (((*(byte *)((long)ud + 0x94) & 1) != 0) &&
                 (0xff < (int)*(uint *)((long)pvVar22 + 0x30))) {
                uVar38 = (ulong)(*(int *)((long)pvVar22 + 8) - 1);
                if (*(uint *)((long)pvVar22 + 0x30) < 0x10000) {
                  for (uVar27 = 0; uVar38 != uVar27; uVar27 = uVar27 + 1) {
                    puVar2 = (ushort *)((long)__dest + uVar27 * 2);
                    *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
                  }
                }
                else {
                  for (uVar27 = 0; uVar38 != uVar27; uVar27 = uVar27 + 1) {
                    uVar32 = *(uint *)((long)__dest + uVar27 * 4);
                    *(uint *)((long)__dest + uVar27 * 4) =
                         uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                         uVar32 << 0x18;
                  }
                }
              }
              uVar32 = *(uint *)((long)pvVar22 + 0x38);
              pcVar20 = (char *)(ulong)uVar32;
              uVar16 = (uint)*(byte *)((long)pvVar22 + 0x24);
              if (*(byte *)((long)pvVar22 + 0x24) != 0) {
                do {
                  uVar38 = (ulong)pcVar20 & 0xffffffff;
                  do {
                    uVar32 = (int)uVar38 + 1;
                    uVar38 = (ulong)uVar32;
                    cVar6 = *pcVar20;
                    pcVar20 = pcVar20 + 1;
                  } while (cVar6 != '\0');
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
            }
            *(uint *)((long)pvVar22 + 0x3c) = uVar32;
            if (uVar10 != uVar9 - *(int *)((long)ud + 0x2c)) goto LAB_00110753;
            pTVar23 = plVar7->top;
            (pTVar23->u32).lo = (uint32_t)pvVar22;
            (pTVar23->field_2).it = 0xfffffff8;
            pTVar23 = plVar7->top;
            plVar7->top = pTVar23 + 1;
            if ((TValue *)(ulong)(plVar7->maxstack).ptr32 <= pTVar23 + 1) {
              lj_state_growstack1(plVar7);
            }
          }
          if (**(char **)((long)ud + 0x30) != '\0') {
            if (uVar9 < 5) goto LAB_00110006;
            goto LAB_00110013;
          }
          uVar9 = uVar9 - 1;
          *(uint *)((long)ud + 0x2c) = uVar9;
          *(char **)((long)ud + 0x30) = *(char **)((long)ud + 0x30) + 1;
LAB_00110657:
          if (((int)uVar9 < 1) &&
             (pTVar23 = plVar7->top + -1,
             pTVar23 == (TValue *)((long)*(int *)((long)ud + 0x5c) + (ulong)(plVar7->stack).ptr32)))
          {
            plVar7->top = pTVar23;
            pt = (GCproto *)(ulong)(pTVar23->u32).lo;
            goto LAB_00110682;
          }
LAB_00110753:
          bcread_error((LexState *)ud,LJ_ERR_BCBAD);
        }
      }
    }
  }
  bcread_error((LexState *)ud,LJ_ERR_BCFMT);
}

Assistant:

static TValue *cpparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  LexState *ls = (LexState *)ud;
  GCproto *pt;
  GCfunc *fn;
  int bc;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  bc = lj_lex_setup(L, ls);
  if (ls->mode && !strchr(ls->mode, bc ? 'b' : 't')) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_XMODE));
    lj_err_throw(L, LUA_ERRSYNTAX);
  }
  pt = bc ? lj_bcread(ls) : lj_parse(ls);
  fn = lj_func_newL_empty(L, pt, tabref(L->env));
  /* Don't combine above/below into one statement. */
  setfuncV(L, L->top++, fn);
  return NULL;
}